

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O2

Stream * rw::readMaterialMatFX(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int *piVar1;
  FILE *__stream;
  uint32 uVar2;
  int32 iVar3;
  int32 iVar4;
  int32 iVar5;
  Texture *pTVar6;
  Texture *pTVar7;
  char *pcVar8;
  undefined8 uVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  float32 fVar13;
  Error _e;
  
  uVar2 = Stream::readU32(stream);
  MatFX::setEffects((Material *)object,uVar2);
  piVar1 = *(int **)((long)object + (long)DAT_00143ca4);
  iVar11 = 2;
  do {
    do {
      while( true ) {
        while( true ) {
          bVar12 = iVar11 == 0;
          iVar11 = iVar11 + -1;
          if (bVar12) {
            return stream;
          }
          uVar2 = Stream::readU32(stream);
          if (uVar2 != 4) break;
          iVar3 = Stream::readI32(stream);
          iVar4 = Stream::readI32(stream);
          iVar5 = Stream::readI32(stream);
          if (iVar5 == 0) {
            pTVar6 = (Texture *)0x0;
          }
          else {
            bVar12 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
            if (!bVar12) {
              uVar9 = 0x1db;
              goto LAB_0012ac84;
            }
            pTVar6 = Texture::streamRead(stream);
          }
          lVar10 = 0;
          if (*piVar1 != 4) {
            lVar10 = (ulong)(piVar1[10] == 4) * 2 + -1;
          }
          *(Texture **)(piVar1 + lVar10 * 10 + 2) = pTVar6;
          piVar1[lVar10 * 10 + 4] = iVar3;
          piVar1[lVar10 * 10 + 5] = iVar4;
        }
        if (uVar2 != 2) break;
        fVar13 = Stream::readF32(stream);
        iVar3 = Stream::readI32(stream);
        iVar4 = Stream::readI32(stream);
        if (iVar4 == 0) {
          pTVar6 = (Texture *)0x0;
        }
        else {
          bVar12 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar12) {
            uVar9 = 0x1c8;
            goto LAB_0012ac84;
          }
          pTVar6 = Texture::streamRead(stream);
        }
        lVar10 = 0;
        if (*piVar1 != 2) {
          lVar10 = (ulong)(piVar1[10] == 2) * 2 + -1;
        }
        *(Texture **)(piVar1 + lVar10 * 10 + 4) = pTVar6;
        piVar1[lVar10 * 10 + 7] = iVar3;
        piVar1[lVar10 * 10 + 6] = (int)fVar13;
      }
    } while (uVar2 != 1);
    fVar13 = Stream::readF32(stream);
    iVar3 = Stream::readI32(stream);
    if (iVar3 == 0) {
      pTVar6 = (Texture *)0x0;
    }
    else {
      bVar12 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
      if (!bVar12) {
        uVar9 = 0x1ad;
        goto LAB_0012ac84;
      }
      pTVar6 = Texture::streamRead(stream);
    }
    iVar3 = Stream::readI32(stream);
    if (iVar3 == 0) {
      pTVar7 = (Texture *)0x0;
    }
    else {
      bVar12 = findChunk(stream,6,(uint32 *)0x0,(uint32 *)0x0);
      if (!bVar12) {
        uVar9 = 0x1b5;
LAB_0012ac84:
        _e.plugin = 0x120;
        _e.code = 0x80000004;
        fprintf(_stderr,"%s:%d: ",
                "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/matfx.cpp",uVar9)
        ;
        __stream = _stderr;
        pcVar8 = dbgsprint(0x80000004,"TEXTURE");
        fprintf(__stream,"%s\n",pcVar8);
        setError(&_e);
        return (Stream *)0x0;
      }
      pTVar7 = Texture::streamRead(stream);
    }
    lVar10 = 0;
    if (*piVar1 != 1) {
      lVar10 = (ulong)(piVar1[10] == 1) * 2 + -1;
    }
    *(Texture **)(piVar1 + lVar10 * 10 + 4) = pTVar6;
    *(Texture **)(piVar1 + lVar10 * 10 + 6) = pTVar7;
    piVar1[lVar10 * 10 + 8] = (int)fVar13;
  } while( true );
}

Assistant:

static Stream*
readMaterialMatFX(Stream *stream, int32, void *object, int32 offset, int32)
{
	Material *mat;
	MatFX *matfx;
	Texture *tex, *bumpedTex;
	float coefficient;
	int32 fbAlpha;
	int32 srcBlend, dstBlend;
	int32 idx;

	mat = (Material*)object;
	MatFX::setEffects(mat, stream->readU32());
	matfx = MatFX::get(mat);

	for(int i = 0; i < 2; i++){
		uint32 type = stream->readU32();
		switch(type){
		case MatFX::BUMPMAP:
			coefficient = stream->readF32();
			bumpedTex = tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				bumpedTex = Texture::streamRead(stream);
			}
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].bump.bumpedTex = bumpedTex;
			matfx->fx[idx].bump.tex = tex;
			matfx->fx[idx].bump.coefficient = coefficient;
			break;

		case MatFX::ENVMAP:
			coefficient = stream->readF32();
			fbAlpha = stream->readI32();
			tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].env.tex = tex;
			matfx->fx[idx].env.fbAlpha = fbAlpha;
			matfx->fx[idx].env.coefficient = coefficient;
			break;

		case MatFX::DUAL:
			srcBlend = stream->readI32();
			dstBlend = stream->readI32();
			tex = nil;
			if(stream->readI32()){
				if(!findChunk(stream, ID_TEXTURE,
				              nil, nil)){
					RWERROR((ERR_CHUNK, "TEXTURE"));
					return nil;
				}
				tex = Texture::streamRead(stream);
			}
			idx = matfx->getEffectIndex(type);
			assert(idx >= 0);
			matfx->fx[idx].dual.tex = tex;
			matfx->fx[idx].dual.srcBlend = srcBlend;
			matfx->fx[idx].dual.dstBlend = dstBlend;
			break;
		}
	}
	return stream;
}